

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::GetString
              (ScriptContext *scriptContext,JavascriptString *input,Var nonMatchValue,
              GroupInfo group)

{
  bool bVar1;
  JavascriptLibrary *pJVar2;
  CharStringCache *this;
  char16 *pcVar3;
  PropertyString *pPVar4;
  PropertyString *propString;
  char16 *inputStr_1;
  char16 *inputStr;
  Var nonMatchValue_local;
  JavascriptString *input_local;
  ScriptContext *scriptContext_local;
  GroupInfo group_local;
  
  scriptContext_local = (ScriptContext *)group;
  bVar1 = UnifiedRegex::GroupInfo::IsUndefined((GroupInfo *)&scriptContext_local);
  group_local = (GroupInfo)nonMatchValue;
  if (!bVar1) {
    if (scriptContext_local._4_4_ == 0) {
      pJVar2 = ScriptContext::GetLibrary(scriptContext);
      group_local = (GroupInfo)JavascriptLibrary::GetEmptyString(pJVar2);
    }
    else if (scriptContext_local._4_4_ == 1) {
      pcVar3 = JavascriptString::GetString(input);
      pJVar2 = ScriptContext::GetLibrary(scriptContext);
      this = JavascriptLibrary::GetCharStringCache(pJVar2);
      group_local = (GroupInfo)
                    CharStringCache::GetStringForChar
                              (this,pcVar3[(ulong)scriptContext_local & 0xffffffff]);
    }
    else {
      if (scriptContext_local._4_4_ == 2) {
        pcVar3 = JavascriptString::GetString(input);
        pPVar4 = ScriptContext::GetPropertyString2
                           (scriptContext,pcVar3[(ulong)scriptContext_local & 0xffffffff],
                            pcVar3[(charcount_t)scriptContext_local + 1]);
        if (pPVar4 != (PropertyString *)0x0) {
          return pPVar4;
        }
      }
      group_local = (GroupInfo)
                    SubString::New(input,(charcount_t)scriptContext_local,scriptContext_local._4_4_)
      ;
    }
  }
  return (Var)group_local;
}

Assistant:

Var RegexHelper::GetString(ScriptContext* scriptContext, JavascriptString* input, Var nonMatchValue, UnifiedRegex::GroupInfo group)
    {
        if (group.IsUndefined())
            return nonMatchValue;
        switch (group.length)
        {
        case 0:
            return scriptContext->GetLibrary()->GetEmptyString();
        case 1:
        {
            const char16* inputStr = input->GetString();
            return scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(inputStr[group.offset]);
        }
        case 2:
        {
            const char16* inputStr = input->GetString();
            PropertyString* propString = scriptContext->GetPropertyString2(inputStr[group.offset], inputStr[group.offset + 1]);
            if (propString != 0)
                return propString;
            // fall-through for default
        }
        default:
            return SubString::New(input, group.offset, group.length);
        }
    }